

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O0

void destroy_link_configuration(AMQP_MESSENGER_LINK_CONFIG *link_config)

{
  AMQP_MESSENGER_LINK_CONFIG *link_config_local;
  
  if (link_config->target_suffix != (char *)0x0) {
    free(link_config->target_suffix);
    link_config->target_suffix = (char *)0x0;
  }
  if (link_config->source_suffix != (char *)0x0) {
    free(link_config->source_suffix);
    link_config->source_suffix = (char *)0x0;
  }
  if (link_config->attach_properties != (MAP_HANDLE)0x0) {
    Map_Destroy(link_config->attach_properties);
    link_config->attach_properties = (MAP_HANDLE)0x0;
  }
  return;
}

Assistant:

static void destroy_link_configuration(AMQP_MESSENGER_LINK_CONFIG* link_config)
{
    if (link_config->target_suffix != NULL)
    {
        free((void*)link_config->target_suffix);
        link_config->target_suffix = NULL;
    }

    if (link_config->source_suffix != NULL)
    {
        free((void*)link_config->source_suffix);
        link_config->source_suffix = NULL;
    }

    if (link_config->attach_properties != NULL)
    {
        Map_Destroy(link_config->attach_properties);
        link_config->attach_properties = NULL;
    }
}